

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

uint32_t ExtraCostCombined_C(uint32_t *X,uint32_t *Y,int length)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = Y[4] + X[4] + X[5] + Y[5];
  if (7 < length) {
    uVar2 = 2;
    do {
      uVar1 = uVar1 + (int)uVar2 *
                      (Y[uVar2 * 2 + 2] + X[uVar2 * 2 + 2] + X[uVar2 * 2 + 3] + Y[uVar2 * 2 + 3]);
      uVar2 = uVar2 + 1;
    } while (((uint)length >> 1) - 1 != uVar2);
  }
  return uVar1;
}

Assistant:

static uint32_t ExtraCostCombined_C(const uint32_t* WEBP_RESTRICT X,
                                    const uint32_t* WEBP_RESTRICT Y,
                                    int length) {
  int i;
  uint32_t cost = X[4] + Y[4] + X[5] + Y[5];
  assert(length % 2 == 0);
  for (i = 2; i < length / 2 - 1; ++i) {
    const int xy0 = X[2 * i + 2] + Y[2 * i + 2];
    const int xy1 = X[2 * i + 3] + Y[2 * i + 3];
    cost += i * (xy0 + xy1);
  }
  return cost;
}